

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_avx.cpp
# Opt level: O0

int ncnn::unary_op_inplace<ncnn::UnaryOp_x86_avx_functor::unary_op_sin>(Mat *a,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [24];
  undefined1 auVar55 [24];
  undefined1 auVar56 [24];
  long *in_RDI;
  float fVar57;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar58 [32];
  __m128 _p_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  unary_op_sin op;
  Mat *m;
  __m256 y2;
  __m256 z;
  __m256 poly_mask;
  __m256 swap_sign_bit;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m128i imm2_2;
  __m128i imm2_1;
  __m128i imm0_2;
  __m128i imm0_1;
  __m256i imm2;
  __m256i imm0;
  __m256 y;
  __m256 sign_bit;
  __m256 xmm3;
  __m256 xmm2;
  __m256 xmm1;
  v4sf y2_1;
  v4sf z_1;
  v4sf poly_mask_1;
  v4sf swap_sign_bit_1;
  v4si emm2;
  v4si emm0;
  v4sf y_1;
  v4sf sign_bit_1;
  v4sf xmm3_1;
  v4sf xmm2_1;
  v4sf xmm1_1;
  undefined8 local_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  int local_163c;
  undefined8 local_1638;
  undefined8 local_1630;
  undefined8 local_1628;
  undefined4 local_1620;
  long local_1618;
  undefined4 local_1610;
  undefined4 local_160c;
  undefined4 local_1608;
  undefined4 local_1604;
  undefined4 local_1600;
  undefined8 local_15f8;
  undefined1 (*local_15f0) [32];
  int local_15e8;
  int local_15e4;
  int local_15e0;
  int local_15dc;
  int local_15d8;
  int local_15d4;
  int local_15d0;
  undefined1 local_15c9 [9];
  long *local_15c0;
  undefined1 local_15b5;
  int local_15b4;
  undefined8 *local_15a8;
  undefined8 *local_15a0;
  undefined8 *local_1590;
  undefined1 (*local_1588) [32];
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined1 (*local_1550) [32];
  undefined1 (*local_1548) [32];
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined1 (*local_1530) [32];
  long local_1528;
  undefined4 local_151c;
  long local_1518;
  undefined1 (*local_1510) [32];
  undefined4 local_1504;
  int local_1500;
  int local_14fc;
  undefined8 *local_14f8;
  undefined4 local_14ec;
  long local_14e8;
  undefined8 *local_14d8;
  undefined8 *local_14b0;
  undefined1 *local_14a8;
  undefined8 *local_14a0;
  undefined1 *local_1498;
  undefined1 (*local_1490) [32];
  undefined1 *local_1488;
  undefined1 local_1480 [8];
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  int local_13a0;
  int iStack_139c;
  int iStack_1398;
  int iStack_1394;
  int iStack_1390;
  int iStack_138c;
  int iStack_1388;
  int iStack_1384;
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_1300 [8];
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined1 local_1140 [32];
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 *local_fd8;
  undefined8 *local_fd0;
  undefined1 *local_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  float *local_f78;
  float *local_f70;
  undefined1 *local_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  float *local_f18;
  float *local_f10;
  undefined1 *local_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  float *local_eb8;
  float *local_eb0;
  undefined1 *local_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  float *local_e58;
  float *local_e50;
  undefined1 *local_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 *local_df8;
  undefined8 *local_df0;
  undefined1 *local_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 *local_d98;
  undefined8 *local_d90;
  undefined1 *local_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 *local_d38;
  undefined8 *local_d30;
  undefined1 *local_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined1 *local_cd8;
  float *local_cd0;
  float *local_cc8;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  float local_c80 [2];
  float afStack_c78 [2];
  float afStack_c70 [2];
  float afStack_c68 [2];
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  float fStack_c08;
  undefined4 uStack_c04;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  undefined4 uStack_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  undefined4 uStack_b84;
  float local_b80 [2];
  float afStack_b78 [2];
  float afStack_b70 [2];
  float afStack_b68 [2];
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  float local_b40 [2];
  float afStack_b38 [2];
  float afStack_b30 [2];
  float afStack_b28 [2];
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  float local_b00 [2];
  float afStack_af8 [2];
  float afStack_af0 [2];
  float afStack_ae8 [2];
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  float local_ac0 [2];
  float afStack_ab8 [2];
  float afStack_ab0 [2];
  float afStack_aa8 [2];
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined4 local_954;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined4 local_934;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  ulong uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  ulong uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 local_710 [8];
  undefined8 uStack_708;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  ulong local_6e0;
  ulong uStack_6d8;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [8];
  undefined8 uStack_6a8;
  ulong local_6a0;
  ulong uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  ulong local_640;
  ulong uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined1 local_5d0 [16];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined4 local_4f4;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined1 *local_478;
  float *local_470;
  float *local_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  undefined8 local_450;
  undefined8 uStack_448;
  float local_440 [2];
  float afStack_438 [2];
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 *local_418;
  undefined8 *local_410;
  undefined1 *local_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  float local_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float *local_3b8;
  float *local_3b0;
  undefined1 *local_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  float local_380 [2];
  float afStack_378 [2];
  float local_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float *local_358;
  float *local_350;
  undefined1 *local_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_320 [2];
  float afStack_318 [2];
  float local_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  float *local_2f8;
  float *local_2f0;
  undefined1 *local_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  float local_2c0 [2];
  float afStack_2b8 [2];
  float local_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float *local_298;
  float *local_290;
  undefined1 *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  float local_260 [2];
  float afStack_258 [2];
  float local_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined1 *local_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 *local_1d8;
  undefined8 *local_1d0;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  float local_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 *local_178;
  undefined8 *local_170;
  undefined1 *local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  float local_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  ulong uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [16];
  ulong local_90;
  ulong uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  ulong local_70;
  ulong uStack_68;
  ulong local_60;
  ulong uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined1 local_40 [16];
  
  local_15d0 = *(int *)((long)in_RDI + 0x2c);
  local_15d4 = (int)in_RDI[6];
  local_15d8 = *(int *)((long)in_RDI + 0x34);
  local_15dc = (int)in_RDI[7];
  local_15e0 = (int)in_RDI[3];
  local_15e4 = local_15d0 * local_15d4 * local_15d8 * local_15e0;
  local_15c0 = in_RDI;
  for (local_15e8 = 0; local_15e8 < local_15dc; local_15e8 = local_15e8 + 1) {
    local_15a8 = &local_1638;
    local_14fc = *(int *)((long)local_15c0 + 0x2c);
    local_1500 = (int)local_15c0[6];
    local_1504 = *(undefined4 *)((long)local_15c0 + 0x34);
    local_1510 = (undefined1 (*) [32])
                 (*local_15c0 + local_15c0[8] * (long)local_15e8 * local_15c0[2]);
    local_1518 = local_15c0[2];
    local_151c = (undefined4)local_15c0[3];
    local_1528 = local_15c0[4];
    local_14f8 = &local_1638;
    local_14e8 = (long)local_14fc * (long)local_1500 * local_1518;
    local_15a0 = &local_1638;
    local_1590 = &local_1638;
    local_14ec = 0x10;
    local_15b4 = local_15e8;
    local_15b5 = 1;
    local_1638 = 0;
    local_1628 = 0;
    local_1620 = 0;
    local_1610 = 0;
    local_160c = 0;
    local_1608 = 0;
    local_1604 = 0;
    local_1600 = 0;
    local_15f8 = 0;
    local_1630 = 0;
    local_15f0 = local_1510;
    for (local_163c = 0; local_163c + 7 < local_15e4; local_163c = local_163c + 8) {
      local_1588 = local_15f0;
      uStack_1190 = *(undefined8 *)(*local_15f0 + 0x10);
      uStack_1188 = *(undefined8 *)(*local_15f0 + 0x18);
      local_14a8 = local_15c9;
      local_14b0 = &local_1660;
      local_1140 = ZEXT832(0) << 0x20;
      local_1260 = SUB168(*(undefined1 (*) [16])*local_15f0,0);
      uStack_1258 = SUB168(*(undefined1 (*) [16])*local_15f0,8);
      local_1160 = local_1260;
      uStack_1158 = uStack_1258;
      local_1180 = 0x7fffffff7fffffff;
      uStack_1178 = 0x7fffffff7fffffff;
      uStack_1170 = 0x7fffffff7fffffff;
      uStack_1168 = 0x7fffffff7fffffff;
      auVar29._8_8_ = 0x7fffffff7fffffff;
      auVar29._0_8_ = 0x7fffffff7fffffff;
      auVar29._16_8_ = 0x7fffffff7fffffff;
      auVar29._24_8_ = 0x7fffffff7fffffff;
      auVar1 = vandps_avx(*local_15f0,auVar29);
      local_11a0 = local_1260;
      uStack_1198 = uStack_1258;
      local_11c0 = 0x8000000080000000;
      uStack_11b8 = 0x8000000080000000;
      uStack_11b0 = 0x8000000080000000;
      uStack_11a8 = 0x8000000080000000;
      auVar28._8_8_ = 0x8000000080000000;
      auVar28._0_8_ = 0x8000000080000000;
      auVar28._16_8_ = 0x8000000080000000;
      auVar28._24_8_ = 0x8000000080000000;
      auVar2 = vandps_avx(*local_15f0,auVar28);
      local_1260 = auVar1._0_8_;
      uVar7 = local_1260;
      uStack_1258 = auVar1._8_8_;
      uVar8 = uStack_1258;
      uStack_1250 = auVar1._16_8_;
      uVar9 = uStack_1250;
      uStack_1248 = auVar1._24_8_;
      uVar10 = uStack_1248;
      local_1020 = 0x3fa2f9833fa2f983;
      uStack_1018 = 0x3fa2f9833fa2f983;
      uStack_1010 = 0x3fa2f9833fa2f983;
      uStack_1008 = 0x3fa2f9833fa2f983;
      local_1000._0_4_ = auVar1._0_4_;
      local_1000._4_4_ = auVar1._4_4_;
      uStack_ff8._0_4_ = auVar1._8_4_;
      uStack_ff8._4_4_ = auVar1._12_4_;
      uStack_ff0._0_4_ = auVar1._16_4_;
      uStack_ff0._4_4_ = auVar1._20_4_;
      uStack_fe8._0_4_ = auVar1._24_4_;
      uStack_fe8._4_4_ = auVar1._28_4_;
      local_1300._4_4_ = local_1000._4_4_ * 1.2732395;
      local_1300._0_4_ = (float)local_1000 * 1.2732395;
      uStack_12f8._0_4_ = (float)uStack_ff8 * 1.2732395;
      uStack_12f8._4_4_ = uStack_ff8._4_4_ * 1.2732395;
      uStack_12f0._0_4_ = (float)uStack_ff0 * 1.2732395;
      uStack_12f0._4_4_ = uStack_ff0._4_4_ * 1.2732395;
      auVar54 = _local_1300;
      uStack_12e8._0_4_ = (float)uStack_fe8 * 1.2732395;
      uStack_12e8._4_4_ = uStack_fe8._4_4_;
      auVar1 = _local_1300;
      local_9c0 = local_1300;
      uStack_9b8 = uStack_12f8;
      uStack_12f0 = auVar54._16_8_;
      uStack_9b0 = uStack_12f0;
      uStack_12e8 = auVar1._24_8_;
      uStack_9a8 = uStack_12e8;
      local_13a0 = (int)((float)local_1000 * 1.2732395);
      iStack_139c = (int)(local_1000._4_4_ * 1.2732395);
      iStack_1398 = (int)((float)uStack_ff8 * 1.2732395);
      iStack_1394 = (int)(uStack_ff8._4_4_ * 1.2732395);
      iStack_1390 = (int)((float)uStack_ff0 * 1.2732395);
      iStack_138c = (int)(uStack_ff0._4_4_ * 1.2732395);
      iStack_1388 = (int)((float)uStack_fe8 * 1.2732395);
      iStack_1384 = (int)uStack_fe8._4_4_;
      local_970 = CONCAT44(iStack_139c,local_13a0);
      uStack_968 = CONCAT44(iStack_1394,iStack_1398);
      local_990 = CONCAT44(iStack_138c,iStack_1390);
      uStack_988 = CONCAT44(iStack_1384,iStack_1388);
      local_9a0 = 0x100000001;
      uStack_998 = 0x100000001;
      auVar6._8_8_ = uStack_968;
      auVar6._0_8_ = local_970;
      auVar3._8_8_ = 0x100000001;
      auVar3._0_8_ = 0x100000001;
      auVar3 = vpaddd_avx(auVar6,auVar3);
      auVar5._8_8_ = uStack_988;
      auVar5._0_8_ = local_990;
      auVar4._8_8_ = 0x100000001;
      auVar4._0_8_ = 0x100000001;
      auVar4 = vpaddd_avx(auVar5,auVar4);
      local_1370._0_8_ = auVar3._0_8_;
      local_850 = local_1370._0_8_;
      local_1370._8_8_ = auVar3._8_8_;
      uStack_848 = local_1370._8_8_;
      local_880 = 0xfffffffefffffffe;
      uStack_878 = 0xfffffffefffffffe;
      auVar37._8_8_ = 0xfffffffefffffffe;
      auVar37._0_8_ = 0xfffffffefffffffe;
      auVar3 = vpand_avx(auVar3,auVar37);
      local_1380._0_8_ = auVar4._0_8_;
      local_870 = local_1380._0_8_;
      local_1380._8_8_ = auVar4._8_8_;
      uStack_868 = local_1380._8_8_;
      auVar36._8_8_ = 0xfffffffefffffffe;
      auVar36._0_8_ = 0xfffffffefffffffe;
      auVar4 = vpand_avx(auVar4,auVar36);
      local_1370._0_8_ = auVar3._0_8_;
      local_13c0 = local_1370._0_8_;
      local_1370._8_8_ = auVar3._8_8_;
      uStack_13b8 = local_1370._8_8_;
      local_1380._0_8_ = auVar4._0_8_;
      uStack_13b0 = local_1380._0_8_;
      local_1380._8_8_ = auVar4._8_8_;
      uStack_13a8 = local_1380._8_8_;
      local_920 = local_1370._0_8_;
      uStack_918 = local_1370._8_8_;
      uStack_910 = local_1380._0_8_;
      uStack_908 = local_1380._8_8_;
      auVar31._16_8_ = local_1380._0_8_;
      auVar31._0_16_ = auVar3;
      auVar31._24_8_ = local_1380._8_8_;
      auVar1 = vcvtdq2ps_avx(auVar31);
      local_890 = local_1370._0_8_;
      uStack_888 = local_1370._8_8_;
      local_8c0 = 0x400000004;
      uStack_8b8 = 0x400000004;
      auVar35._8_8_ = 0x400000004;
      auVar35._0_8_ = 0x400000004;
      auVar5 = vpand_avx(auVar3,auVar35);
      local_8b0 = local_1380._0_8_;
      uStack_8a8 = local_1380._8_8_;
      auVar34._8_8_ = 0x400000004;
      auVar34._0_8_ = 0x400000004;
      auVar6 = vpand_avx(auVar4,auVar34);
      local_1350._0_8_ = auVar5._0_8_;
      local_930 = local_1350._0_8_;
      local_1350._8_8_ = auVar5._8_8_;
      uStack_928 = local_1350._8_8_;
      local_934 = 0x1d;
      local_1350 = vpslld_avx(auVar5,ZEXT416(0x1d));
      local_1360._0_8_ = auVar6._0_8_;
      local_950 = local_1360._0_8_;
      local_1360._8_8_ = auVar6._8_8_;
      uStack_948 = local_1360._8_8_;
      local_954 = 0x1d;
      local_1360 = vpslld_avx(auVar6,ZEXT416(0x1d));
      local_13e0 = local_1350._0_8_;
      uStack_13d8 = local_1350._8_8_;
      uStack_13d0 = local_1360._0_8_;
      uStack_13c8 = local_1360._8_8_;
      local_1320 = local_1350._0_8_;
      uStack_1318 = local_1350._8_8_;
      uStack_1310 = local_1360._0_8_;
      uStack_1308 = local_1360._8_8_;
      local_8d0 = local_1370._0_8_;
      uStack_8c8 = local_1370._8_8_;
      local_900 = 0x200000002;
      uStack_8f8 = 0x200000002;
      auVar33._8_8_ = 0x200000002;
      auVar33._0_8_ = 0x200000002;
      auVar3 = vpand_avx(auVar3,auVar33);
      local_8f0 = local_1380._0_8_;
      uStack_8e8 = local_1380._8_8_;
      auVar32._8_8_ = 0x200000002;
      auVar32._0_8_ = 0x200000002;
      auVar4 = vpand_avx(auVar4,auVar32);
      local_1370._0_8_ = auVar3._0_8_;
      local_810 = local_1370._0_8_;
      local_1370._8_8_ = auVar3._8_8_;
      uStack_808 = local_1370._8_8_;
      local_800 = ZEXT816(0) << 0x20;
      local_820 = 0;
      local_7f0._8_8_ = SUB168(ZEXT816(0),4);
      uStack_818 = local_7f0._8_8_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_7f0._8_8_;
      local_1370 = vpcmpeqd_avx(auVar3,auVar51 << 0x40);
      local_1380._0_8_ = auVar4._0_8_;
      local_830 = local_1380._0_8_;
      local_1380._8_8_ = auVar4._8_8_;
      uStack_828 = local_1380._8_8_;
      local_840 = 0;
      uStack_838 = local_7f0._8_8_;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_7f0._8_8_;
      local_1380 = vpcmpeqd_avx(auVar4,auVar52 << 0x40);
      local_1400 = local_1370._0_8_;
      uStack_13f8 = local_1370._8_8_;
      uStack_13f0 = local_1380._0_8_;
      uStack_13e8 = local_1380._8_8_;
      local_1340 = local_1370._0_8_;
      uStack_1338 = local_1370._8_8_;
      uStack_1330 = local_1380._0_8_;
      uStack_1328 = local_1380._8_8_;
      local_1220 = local_1350._0_8_;
      uStack_1218 = local_1350._8_8_;
      uStack_1210 = local_1360._0_8_;
      uStack_1208 = local_1360._8_8_;
      local_1420 = local_1350._0_8_;
      uStack_1418 = local_1350._8_8_;
      uStack_1410 = local_1360._0_8_;
      uStack_1408 = local_1360._8_8_;
      local_1240 = local_1370._0_8_;
      uStack_1238 = local_1370._8_8_;
      uStack_1230 = local_1380._0_8_;
      uStack_1228 = local_1380._8_8_;
      local_1440 = local_1370._0_8_;
      uStack_1438 = local_1370._8_8_;
      uStack_1430 = local_1380._0_8_;
      uStack_1428 = local_1380._8_8_;
      local_12e0 = auVar2._0_8_;
      uVar11 = local_12e0;
      uStack_12d8 = auVar2._8_8_;
      uVar12 = uStack_12d8;
      uStack_12d0 = auVar2._16_8_;
      uVar13 = uStack_12d0;
      uStack_12c8 = auVar2._24_8_;
      uVar14 = uStack_12c8;
      local_780._0_4_ = auVar2._0_4_;
      local_780._4_4_ = auVar2._4_4_;
      uStack_778._0_4_ = auVar2._8_4_;
      uStack_778._4_4_ = auVar2._12_4_;
      uStack_770._0_4_ = auVar2._16_4_;
      uStack_770._4_4_ = auVar2._20_4_;
      uStack_768._0_4_ = auVar2._24_4_;
      uStack_768._4_4_ = auVar2._28_4_;
      local_7a0._0_4_ = local_1350._0_4_;
      local_7a0._4_4_ = local_1350._4_4_;
      uStack_798._0_4_ = local_1350._8_4_;
      uStack_798._4_4_ = local_1350._12_4_;
      uStack_790._0_4_ = local_1360._0_4_;
      uStack_790._4_4_ = local_1360._4_4_;
      uStack_788._0_4_ = local_1360._8_4_;
      uStack_788._4_4_ = local_1360._12_4_;
      local_12e0 = CONCAT44(local_780._4_4_ ^ local_7a0._4_4_,(uint)local_780 ^ (uint)local_7a0);
      uStack_12d8._0_4_ = (uint)uStack_778 ^ (uint)uStack_798;
      uStack_12d8._4_4_ = uStack_778._4_4_ ^ uStack_798._4_4_;
      uStack_12d0._0_4_ = (uint)uStack_770 ^ (uint)uStack_790;
      uStack_12d0._4_4_ = uStack_770._4_4_ ^ uStack_790._4_4_;
      auVar56 = _local_12e0;
      uStack_12c8._0_4_ = (uint)uStack_768 ^ (uint)uStack_788;
      uStack_12c8._4_4_ = uStack_768._4_4_ ^ uStack_788._4_4_;
      auVar29 = _local_12e0;
      local_1280 = 0xbf490000bf490000;
      uStack_1278 = 0xbf490000bf490000;
      uStack_1270 = 0xbf490000bf490000;
      uStack_1268 = 0xbf490000bf490000;
      local_12a0 = 0xb97da000b97da000;
      uStack_1298 = 0xb97da000b97da000;
      uStack_1290 = 0xb97da000b97da000;
      uStack_1288 = 0xb97da000b97da000;
      local_ea8 = local_1300;
      local_d30 = &local_1280;
      local_fd8 = &local_1260;
      local_1300 = auVar1._0_8_;
      uVar15 = local_1300;
      uStack_12f8 = auVar1._8_8_;
      uVar16 = uStack_12f8;
      uStack_12f0 = auVar1._16_8_;
      uVar17 = uStack_12f0;
      uStack_12e8 = auVar1._24_8_;
      uVar18 = uStack_12e8;
      local_d20 = 0xbf490000bf490000;
      uStack_d18 = 0xbf490000bf490000;
      uStack_d10 = 0xbf490000bf490000;
      uStack_d08 = 0xbf490000bf490000;
      local_d00._0_4_ = auVar1._0_4_;
      local_d00._4_4_ = auVar1._4_4_;
      uStack_cf8._0_4_ = auVar1._8_4_;
      uStack_cf8._4_4_ = auVar1._12_4_;
      uStack_cf0._0_4_ = auVar1._16_4_;
      uStack_cf0._4_4_ = auVar1._20_4_;
      uStack_ce8._0_4_ = auVar1._24_4_;
      uStack_c04 = 0xbf490000;
      local_c20 = (float)local_d00 * -0.78515625;
      fStack_c1c = local_d00._4_4_ * -0.78515625;
      fStack_c18 = (float)uStack_cf8 * -0.78515625;
      fStack_c14 = uStack_cf8._4_4_ * -0.78515625;
      fStack_c10 = (float)uStack_cf0 * -0.78515625;
      fStack_c0c = uStack_cf0._4_4_ * -0.78515625;
      fStack_c08 = (float)uStack_ce8 * -0.78515625;
      local_c40 = local_1260;
      uStack_c38 = uStack_1258;
      uStack_c30 = uStack_1250;
      uStack_c28 = uStack_1248;
      local_1260 = CONCAT44(fStack_c1c + local_1000._4_4_,local_c20 + (float)local_1000);
      uStack_1258._0_4_ = fStack_c18 + (float)uStack_ff8;
      uStack_1258._4_4_ = fStack_c14 + uStack_ff8._4_4_;
      uStack_1250._0_4_ = fStack_c10 + (float)uStack_ff0;
      uStack_1250._4_4_ = fStack_c0c + uStack_ff0._4_4_;
      auVar54 = _local_1260;
      uStack_1248._0_4_ = fStack_c08 + (float)uStack_fe8;
      uStack_1248._4_4_ = uStack_fe8._4_4_ + -0.78515625;
      auVar1 = _local_1260;
      local_d90 = &local_12a0;
      local_d60 = local_1300;
      uStack_d58 = uStack_12f8;
      uStack_d50 = uStack_12f0;
      uStack_d48 = uStack_12e8;
      local_d80 = 0xb97da000b97da000;
      uStack_d78 = 0xb97da000b97da000;
      uStack_d70 = 0xb97da000b97da000;
      uStack_d68 = 0xb97da000b97da000;
      uStack_bc4 = 0xb97da000;
      local_be0 = (float)local_d00 * -0.00024187565;
      fStack_bdc = local_d00._4_4_ * -0.00024187565;
      fStack_bd8 = (float)uStack_cf8 * -0.00024187565;
      fStack_bd4 = uStack_cf8._4_4_ * -0.00024187565;
      fStack_bd0 = (float)uStack_cf0 * -0.00024187565;
      fStack_bcc = uStack_cf0._4_4_ * -0.00024187565;
      fStack_bc8 = (float)uStack_ce8 * -0.00024187565;
      local_c00 = local_1260;
      uStack_bf8 = uStack_1258;
      uStack_1250 = auVar54._16_8_;
      uStack_bf0 = uStack_1250;
      uStack_1248 = auVar1._24_8_;
      uStack_be8 = uStack_1248;
      fVar57 = local_be0 + local_c20 + (float)local_1000;
      fVar59 = fStack_bdc + fStack_c1c + local_1000._4_4_;
      fVar60 = fStack_bd8 + fStack_c18 + (float)uStack_ff8;
      fVar62 = fStack_bd4 + fStack_c14 + uStack_ff8._4_4_;
      fVar64 = fStack_bd0 + fStack_c10 + (float)uStack_ff0;
      fVar66 = fStack_bcc + fStack_c0c + uStack_ff0._4_4_;
      fVar68 = fStack_bc8 + fStack_c08 + (float)uStack_fe8;
      fStack_1444 = uStack_fe8._4_4_ + -0.78515625 + -0.00024187565;
      local_1260 = CONCAT44(fVar59,fVar57);
      uStack_1258._0_4_ = fVar60;
      uStack_1258._4_4_ = fVar62;
      uStack_1250._0_4_ = fVar64;
      uStack_1250._4_4_ = fVar66;
      auVar54 = _local_1260;
      uStack_1248._0_4_ = fVar68;
      uStack_1248._4_4_ = fStack_1444;
      auVar1 = _local_1260;
      local_df0 = &local_12c0;
      local_dc0 = local_1300;
      uStack_db8 = uStack_12f8;
      uStack_db0 = uStack_12f0;
      uStack_da8 = uStack_12e8;
      local_de0 = 0xb3222169b3222169;
      uStack_dd8 = 0xb3222169b3222169;
      uStack_dd0 = 0xb3222169b3222169;
      uStack_dc8 = 0xb3222169b3222169;
      uStack_b84 = 0xb3222169;
      local_ba0 = (float)local_d00 * -3.774895e-08;
      fStack_b9c = local_d00._4_4_ * -3.774895e-08;
      fStack_b98 = (float)uStack_cf8 * -3.774895e-08;
      fStack_b94 = uStack_cf8._4_4_ * -3.774895e-08;
      fStack_b90 = (float)uStack_cf0 * -3.774895e-08;
      fStack_b8c = uStack_cf0._4_4_ * -3.774895e-08;
      fStack_b88 = (float)uStack_ce8 * -3.774895e-08;
      local_bc0 = local_1260;
      uStack_bb8 = uStack_1258;
      uStack_1250 = auVar54._16_8_;
      uStack_bb0 = uStack_1250;
      uStack_1248 = auVar1._24_8_;
      uStack_ba8 = uStack_1248;
      fVar57 = local_ba0 + fVar57;
      fVar59 = fStack_b9c + fVar59;
      fVar60 = fStack_b98 + fVar60;
      fVar62 = fStack_b94 + fVar62;
      fVar64 = fStack_b90 + fVar64;
      fVar66 = fStack_b8c + fVar66;
      fVar68 = fStack_b88 + fVar68;
      fStack_1444 = fStack_1444 + -3.774895e-08;
      local_1260 = CONCAT44(fVar59,fVar57);
      uStack_1258._0_4_ = fVar60;
      uStack_1258._4_4_ = fVar62;
      uStack_1250._0_4_ = fVar64;
      uStack_1250._4_4_ = fVar66;
      auVar54 = _local_1260;
      uStack_1248._0_4_ = fVar68;
      uStack_1248._4_4_ = fStack_1444;
      auVar31 = _local_1260;
      local_1060 = local_1260;
      uStack_1058 = uStack_1258;
      uStack_1250 = auVar54._16_8_;
      uStack_1050 = uStack_1250;
      uStack_1248 = auVar31._24_8_;
      uStack_1048 = uStack_1248;
      local_1460 = fVar57 * fVar57;
      fStack_145c = fVar59 * fVar59;
      fStack_1458 = fVar60 * fVar60;
      fStack_1454 = fVar62 * fVar62;
      fStack_1450 = fVar64 * fVar64;
      fStack_144c = fVar66 * fVar66;
      fStack_1448 = fVar68 * fVar68;
      local_f70 = &local_1460;
      local_e58 = _ps256_coscof_p1;
      local_e20 = 0x37ccf5ce37ccf5ce;
      uStack_e18 = 0x37ccf5ce37ccf5ce;
      uStack_e10 = 0x37ccf5ce37ccf5ce;
      uStack_e08 = 0x37ccf5ce37ccf5ce;
      local_e40 = CONCAT44(fStack_145c,local_1460);
      uStack_e38 = CONCAT44(fStack_1454,fStack_1458);
      uStack_e30 = CONCAT44(fStack_144c,fStack_1450);
      uStack_e28 = CONCAT44(fStack_1444,fStack_1448);
      local_b60 = local_1460 * 2.4433157e-05;
      fStack_b5c = fStack_145c * 2.4433157e-05;
      fStack_b58 = fStack_1458 * 2.4433157e-05;
      fStack_b54 = fStack_1454 * 2.4433157e-05;
      fStack_b50 = fStack_1450 * 2.4433157e-05;
      fStack_b4c = fStack_144c * 2.4433157e-05;
      fStack_b48 = fStack_1448 * 2.4433157e-05;
      local_b80[0] = -0.0013887316;
      local_b80[1] = -0.0013887316;
      afStack_b78[0] = -0.0013887316;
      afStack_b78[1] = -0.0013887316;
      afStack_b70[0] = -0.0013887316;
      afStack_b70[1] = -0.0013887316;
      afStack_b68[0] = -0.0013887316;
      afStack_b68[1] = -0.0013887316;
      local_1300._4_4_ = fStack_b5c + -0.0013887316;
      local_1300._0_4_ = local_b60 + -0.0013887316;
      uStack_12f8._0_4_ = fStack_b58 + -0.0013887316;
      uStack_12f8._4_4_ = fStack_b54 + -0.0013887316;
      uStack_12f0._0_4_ = fStack_b50 + -0.0013887316;
      uStack_12f0._4_4_ = fStack_b4c + -0.0013887316;
      auVar54 = _local_1300;
      uStack_12e8._0_4_ = fStack_b48 + -0.0013887316;
      uStack_12e8._4_4_ = fStack_1444 + -0.0013887316;
      auVar1 = _local_1300;
      local_eb8 = _ps256_coscof_p2;
      local_e80 = local_1300;
      uStack_e78 = uStack_12f8;
      uStack_12f0 = auVar54._16_8_;
      uStack_e70 = uStack_12f0;
      uStack_12e8 = auVar1._24_8_;
      uStack_e68 = uStack_12e8;
      local_ea0 = CONCAT44(fStack_145c,local_1460);
      uStack_e98 = CONCAT44(fStack_1454,fStack_1458);
      uStack_e90 = CONCAT44(fStack_144c,fStack_1450);
      uStack_e88 = CONCAT44(fStack_1444,fStack_1448);
      local_b20 = (local_b60 + -0.0013887316) * local_1460;
      fStack_b1c = (fStack_b5c + -0.0013887316) * fStack_145c;
      fStack_b18 = (fStack_b58 + -0.0013887316) * fStack_1458;
      fStack_b14 = (fStack_b54 + -0.0013887316) * fStack_1454;
      fStack_b10 = (fStack_b50 + -0.0013887316) * fStack_1450;
      fStack_b0c = (fStack_b4c + -0.0013887316) * fStack_144c;
      fStack_b08 = (fStack_b48 + -0.0013887316) * fStack_1448;
      local_b40[0] = 0.041666646;
      local_b40[1] = 0.041666646;
      afStack_b38[0] = 0.041666646;
      afStack_b38[1] = 0.041666646;
      afStack_b30[0] = 0.041666646;
      afStack_b30[1] = 0.041666646;
      afStack_b28[0] = 0.041666646;
      afStack_b28[1] = 0.041666646;
      fVar70 = fStack_1444 + 0.041666646;
      local_1300._4_4_ = fStack_b1c + 0.041666646;
      local_1300._0_4_ = local_b20 + 0.041666646;
      uStack_12f8._0_4_ = fStack_b18 + 0.041666646;
      uStack_12f8._4_4_ = fStack_b14 + 0.041666646;
      uStack_12f0._0_4_ = fStack_b10 + 0.041666646;
      uStack_12f0._4_4_ = fStack_b0c + 0.041666646;
      auVar54 = _local_1300;
      uStack_12e8._0_4_ = fStack_b08 + 0.041666646;
      uStack_12e8._4_4_ = fVar70;
      auVar1 = _local_1300;
      local_1080 = local_1300;
      uStack_1078 = uStack_12f8;
      uStack_12f0 = auVar54._16_8_;
      uStack_1070 = uStack_12f0;
      uStack_12e8 = auVar1._24_8_;
      uStack_1068 = uStack_12e8;
      local_10a0 = CONCAT44(fStack_145c,local_1460);
      uStack_1098 = CONCAT44(fStack_1454,fStack_1458);
      uStack_1090 = CONCAT44(fStack_144c,fStack_1450);
      uStack_1088 = CONCAT44(fStack_1444,fStack_1448);
      local_1300._0_4_ = (local_b20 + 0.041666646) * local_1460;
      local_1300._4_4_ = (fStack_b1c + 0.041666646) * fStack_145c;
      fVar61 = (fStack_b18 + 0.041666646) * fStack_1458;
      fVar63 = (fStack_b14 + 0.041666646) * fStack_1454;
      fVar65 = (fStack_b10 + 0.041666646) * fStack_1450;
      fVar67 = (fStack_b0c + 0.041666646) * fStack_144c;
      fVar69 = (fStack_b08 + 0.041666646) * fStack_1448;
      uStack_12f8._0_4_ = fVar61;
      uStack_12f8._4_4_ = fVar63;
      uStack_12f0._0_4_ = fVar65;
      uStack_12f0._4_4_ = fVar67;
      auVar54 = _local_1300;
      uStack_12e8._0_4_ = fVar69;
      auVar1 = _local_1300;
      local_10c0 = local_1300;
      uStack_10b8 = uStack_12f8;
      uStack_12f0 = auVar54._16_8_;
      uStack_10b0 = uStack_12f0;
      uStack_12e8 = auVar1._24_8_;
      uStack_10a8 = uStack_12e8;
      local_10e0 = CONCAT44(fStack_145c,local_1460);
      uStack_10d8 = CONCAT44(fStack_1454,fStack_1458);
      uStack_10d0 = CONCAT44(fStack_144c,fStack_1450);
      uStack_10c8 = CONCAT44(fStack_1444,fStack_1448);
      local_1300._4_4_ = (float)local_1300._4_4_ * fStack_145c;
      local_1300._0_4_ = (float)local_1300._0_4_ * local_1460;
      uStack_12f8._0_4_ = fVar61 * fStack_1458;
      uStack_12f8._4_4_ = fVar63 * fStack_1454;
      uStack_12f0._0_4_ = fVar65 * fStack_1450;
      uStack_12f0._4_4_ = fVar67 * fStack_144c;
      auVar54 = _local_1300;
      uStack_12e8._0_4_ = fVar69 * fStack_1448;
      auVar1 = _local_1300;
      local_cd0 = ::_ps256_0p5;
      local_ca0 = local_1300;
      uStack_c98 = uStack_12f8;
      uStack_12f0 = auVar54._16_8_;
      uStack_c90 = uStack_12f0;
      uStack_12e8 = auVar1._24_8_;
      uStack_c88 = uStack_12e8;
      local_c60 = CONCAT44(fStack_145c,local_1460);
      uStack_c58 = CONCAT44(fStack_1454,fStack_1458);
      uStack_c50 = CONCAT44(fStack_144c,fStack_1450);
      uStack_c48 = CONCAT44(fStack_1444,fStack_1448);
      local_c80[0] = 0.5;
      local_c80[1] = 0.5;
      afStack_c78[0] = 0.5;
      afStack_c78[1] = 0.5;
      afStack_c70[0] = 0.5;
      afStack_c70[1] = 0.5;
      afStack_c68[0] = 0.5;
      afStack_c68[1] = 0.5;
      local_cc0 = local_1460 * 0.5;
      fStack_cbc = fStack_145c * 0.5;
      fStack_cb8 = fStack_1458 * 0.5;
      fStack_cb4 = fStack_1454 * 0.5;
      fStack_cb0 = fStack_1450 * 0.5;
      fStack_cac = fStack_144c * 0.5;
      fStack_ca8 = fStack_1448 * 0.5;
      auVar30._4_4_ = fStack_cbc;
      auVar30._0_4_ = local_cc0;
      auVar30._8_4_ = fStack_cb8;
      auVar30._12_4_ = fStack_cb4;
      auVar30._16_4_ = fStack_cb0;
      auVar30._20_4_ = fStack_cac;
      auVar30._24_4_ = fStack_ca8;
      auVar30._28_4_ = fStack_1444;
      auVar1 = vsubps_avx(auVar1,auVar30);
      local_1300 = auVar1._0_8_;
      uVar19 = local_1300;
      uStack_12f8 = auVar1._8_8_;
      uVar20 = uStack_12f8;
      uStack_12f0 = auVar1._16_8_;
      uVar21 = uStack_12f0;
      uStack_12e8 = auVar1._24_8_;
      uVar22 = uStack_12e8;
      local_a00 = 0x3f8000003f800000;
      uStack_9f8 = 0x3f8000003f800000;
      uStack_9f0 = 0x3f8000003f800000;
      uStack_9e8 = 0x3f8000003f800000;
      local_9e0._0_4_ = auVar1._0_4_;
      local_9e0._4_4_ = auVar1._4_4_;
      uStack_9d8._0_4_ = auVar1._8_4_;
      uStack_9d8._4_4_ = auVar1._12_4_;
      uStack_9d0._0_4_ = auVar1._16_4_;
      uStack_9d0._4_4_ = auVar1._20_4_;
      uStack_9c8._0_4_ = auVar1._24_4_;
      uStack_9c8._4_4_ = auVar1._28_4_;
      local_1300._4_4_ = local_9e0._4_4_ + 1.0;
      local_1300._0_4_ = (float)local_9e0 + 1.0;
      uStack_12f8._0_4_ = (float)uStack_9d8 + 1.0;
      uStack_12f8._4_4_ = uStack_9d8._4_4_ + 1.0;
      uStack_12f0._0_4_ = (float)uStack_9d0 + 1.0;
      uStack_12f0._4_4_ = uStack_9d0._4_4_ + 1.0;
      auVar55 = _local_1300;
      uStack_12e8._0_4_ = (float)uStack_9c8 + 1.0;
      uStack_12e8._4_4_ = uStack_9c8._4_4_ + 1.0;
      auVar28 = _local_1300;
      local_fc8 = local_1480;
      local_f18 = _ps256_sincof_p1;
      local_ee0 = 0xb94ca1f9b94ca1f9;
      uStack_ed8 = 0xb94ca1f9b94ca1f9;
      uStack_ed0 = 0xb94ca1f9b94ca1f9;
      uStack_ec8 = 0xb94ca1f9b94ca1f9;
      local_f00 = CONCAT44(fStack_145c,local_1460);
      uStack_ef8 = CONCAT44(fStack_1454,fStack_1458);
      uStack_ef0 = CONCAT44(fStack_144c,fStack_1450);
      uStack_ee8 = CONCAT44(fStack_1444,fStack_1448);
      local_ae0 = local_1460 * -0.00019515296;
      fStack_adc = fStack_145c * -0.00019515296;
      fStack_ad8 = fStack_1458 * -0.00019515296;
      fStack_ad4 = fStack_1454 * -0.00019515296;
      fStack_ad0 = fStack_1450 * -0.00019515296;
      fStack_acc = fStack_144c * -0.00019515296;
      fStack_ac8 = fStack_1448 * -0.00019515296;
      local_b00[0] = 0.008332161;
      local_b00[1] = 0.008332161;
      afStack_af8[0] = 0.008332161;
      afStack_af8[1] = 0.008332161;
      afStack_af0[0] = 0.008332161;
      afStack_af0[1] = 0.008332161;
      afStack_ae8[0] = 0.008332161;
      afStack_ae8[1] = 0.008332161;
      local_1480._4_4_ = fStack_adc + 0.008332161;
      local_1480._0_4_ = local_ae0 + 0.008332161;
      uStack_1478._0_4_ = fStack_ad8 + 0.008332161;
      uStack_1478._4_4_ = fStack_ad4 + 0.008332161;
      uStack_1470._0_4_ = fStack_ad0 + 0.008332161;
      uStack_1470._4_4_ = fStack_acc + 0.008332161;
      auVar54 = _local_1480;
      uStack_1468._0_4_ = fStack_ac8 + 0.008332161;
      uStack_1468._4_4_ = fStack_1444 + 0.008332161;
      auVar1 = _local_1480;
      local_f78 = _ps256_sincof_p2;
      local_f40 = local_1480;
      uStack_f38 = uStack_1478;
      uStack_1470 = auVar54._16_8_;
      uStack_f30 = uStack_1470;
      uStack_1468 = auVar1._24_8_;
      uStack_f28 = uStack_1468;
      local_f60 = CONCAT44(fStack_145c,local_1460);
      uStack_f58 = CONCAT44(fStack_1454,fStack_1458);
      uStack_f50 = CONCAT44(fStack_144c,fStack_1450);
      uStack_f48 = CONCAT44(fStack_1444,fStack_1448);
      local_aa0 = (local_ae0 + 0.008332161) * local_1460;
      fStack_a9c = (fStack_adc + 0.008332161) * fStack_145c;
      fStack_a98 = (fStack_ad8 + 0.008332161) * fStack_1458;
      fStack_a94 = (fStack_ad4 + 0.008332161) * fStack_1454;
      fStack_a90 = (fStack_ad0 + 0.008332161) * fStack_1450;
      fStack_a8c = (fStack_acc + 0.008332161) * fStack_144c;
      fStack_a88 = (fStack_ac8 + 0.008332161) * fStack_1448;
      local_ac0[0] = -0.16666655;
      local_ac0[1] = -0.16666655;
      afStack_ab8[0] = -0.16666655;
      afStack_ab8[1] = -0.16666655;
      afStack_ab0[0] = -0.16666655;
      afStack_ab0[1] = -0.16666655;
      afStack_aa8[0] = -0.16666655;
      afStack_aa8[1] = -0.16666655;
      local_1480._4_4_ = fStack_a9c + -0.16666655;
      local_1480._0_4_ = local_aa0 + -0.16666655;
      uStack_1478._0_4_ = fStack_a98 + -0.16666655;
      uStack_1478._4_4_ = fStack_a94 + -0.16666655;
      uStack_1470._0_4_ = fStack_a90 + -0.16666655;
      uStack_1470._4_4_ = fStack_a8c + -0.16666655;
      auVar54 = _local_1480;
      uStack_1468._0_4_ = fStack_a88 + -0.16666655;
      uStack_1468._4_4_ = fStack_1444 + -0.16666655;
      auVar1 = _local_1480;
      local_1100 = local_1480;
      uStack_10f8 = uStack_1478;
      uStack_1470 = auVar54._16_8_;
      uStack_10f0 = uStack_1470;
      uStack_1468 = auVar1._24_8_;
      uStack_10e8 = uStack_1468;
      local_1120 = CONCAT44(fStack_145c,local_1460);
      uStack_1118 = CONCAT44(fStack_1454,fStack_1458);
      uStack_1110 = CONCAT44(fStack_144c,fStack_1450);
      uStack_1108 = CONCAT44(fStack_1444,fStack_1448);
      local_1480._0_4_ = (local_aa0 + -0.16666655) * local_1460;
      local_1480._4_4_ = (fStack_a9c + -0.16666655) * fStack_145c;
      fStack_a58 = (fStack_a98 + -0.16666655) * fStack_1458;
      fStack_a54 = (fStack_a94 + -0.16666655) * fStack_1454;
      fStack_a50 = (fStack_a90 + -0.16666655) * fStack_1450;
      fStack_a4c = (fStack_a8c + -0.16666655) * fStack_144c;
      fStack_a48 = (fStack_a88 + -0.16666655) * fStack_1448;
      uStack_1478._0_4_ = fStack_a58;
      uStack_1478._4_4_ = fStack_a54;
      uStack_1470._0_4_ = fStack_a50;
      uStack_1470._4_4_ = fStack_a4c;
      auVar54 = _local_1480;
      uStack_1468._0_4_ = fStack_a48;
      auVar1 = _local_1480;
      local_fa0 = local_1480;
      uStack_f98 = uStack_1478;
      uStack_1470 = auVar54._16_8_;
      uStack_f90 = uStack_1470;
      uStack_1468 = auVar1._24_8_;
      uStack_f88 = uStack_1468;
      local_fc0 = local_1260;
      uStack_fb8 = uStack_1258;
      uStack_fb0 = uStack_1250;
      uStack_fa8 = uStack_1248;
      local_a60 = (float)local_1480._0_4_ * fVar57;
      fStack_a5c = (float)local_1480._4_4_ * fVar59;
      fStack_a58 = fStack_a58 * fVar60;
      fStack_a54 = fStack_a54 * fVar62;
      fStack_a50 = fStack_a50 * fVar64;
      fStack_a4c = fStack_a4c * fVar66;
      fStack_a48 = fStack_a48 * fVar68;
      local_a80 = local_1260;
      uStack_a78 = uStack_1258;
      uStack_a70 = uStack_1250;
      uStack_a68 = uStack_1248;
      local_1480._4_4_ = fStack_a5c + fVar59;
      local_1480._0_4_ = local_a60 + fVar57;
      uStack_1478._0_4_ = fStack_a58 + fVar60;
      uStack_1478._4_4_ = fStack_a54 + fVar62;
      uStack_1470._0_4_ = fStack_a50 + fVar64;
      uStack_1470._4_4_ = fStack_a4c + fVar66;
      auVar54 = _local_1480;
      uStack_1468._0_4_ = fStack_a48 + fVar68;
      uStack_1468._4_4_ = fStack_1444 + fStack_1444;
      auVar1 = _local_1480;
      local_12c0 = local_1370._0_8_;
      uStack_12b8 = local_1370._8_8_;
      uStack_12b0 = local_1380._0_8_;
      uStack_12a8 = local_1380._8_8_;
      local_11e0 = local_1370._0_8_;
      uStack_11d8 = local_1370._8_8_;
      uStack_11d0 = local_1380._0_8_;
      uStack_11c8 = local_1380._8_8_;
      local_1200 = local_1480;
      uStack_11f8 = uStack_1478;
      uStack_1470 = auVar54._16_8_;
      uStack_11f0 = uStack_1470;
      uStack_1468 = auVar1._24_8_;
      uStack_11e8 = uStack_1468;
      auVar27._16_8_ = local_1380._0_8_;
      auVar27._0_16_ = local_1370;
      auVar27._24_8_ = local_1380._8_8_;
      auVar2._16_8_ = uStack_1470;
      auVar2._0_16_ = _local_1480;
      auVar2._24_8_ = uStack_1468;
      _local_1480 = vandps_avx(auVar27,auVar2);
      local_760 = local_1300;
      uStack_758 = uStack_12f8;
      uStack_12f0 = auVar55._16_8_;
      uStack_750 = uStack_12f0;
      uStack_12e8 = auVar28._24_8_;
      uStack_748 = uStack_12e8;
      local_740._0_4_ = local_1370._0_4_;
      local_740._4_4_ = local_1370._4_4_;
      uStack_738._0_4_ = local_1370._8_4_;
      uStack_738._4_4_ = local_1370._12_4_;
      uStack_730._0_4_ = local_1380._0_4_;
      uStack_730._4_4_ = local_1380._4_4_;
      uStack_728._0_4_ = local_1380._8_4_;
      uStack_728._4_4_ = local_1380._12_4_;
      auVar1 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar58._0_4_ = (uint)local_740 ^ auVar1._0_4_;
      auVar58._4_4_ = local_740._4_4_ ^ auVar1._4_4_;
      auVar58._8_4_ = (uint)uStack_738 ^ auVar1._8_4_;
      auVar58._12_4_ = uStack_738._4_4_ ^ auVar1._12_4_;
      auVar58._16_4_ = (uint)uStack_730 ^ auVar1._16_4_;
      auVar58._20_4_ = uStack_730._4_4_ ^ auVar1._20_4_;
      auVar58._24_4_ = (uint)uStack_728 ^ auVar1._24_4_;
      auVar58._28_4_ = uStack_728._4_4_ ^ auVar1._28_4_;
      auVar38._16_8_ = uStack_12f0;
      auVar38._0_16_ = _local_1300;
      auVar38._24_8_ = uStack_12e8;
      auVar1 = vandps_avx(auVar58,auVar38);
      local_1300 = auVar1._0_8_;
      uVar23 = local_1300;
      uStack_12f8 = auVar1._8_8_;
      uVar24 = uStack_12f8;
      uStack_12f0 = auVar1._16_8_;
      uVar25 = uStack_12f0;
      uStack_12e8 = auVar1._24_8_;
      uVar26 = uStack_12e8;
      local_a20._0_4_ = auVar1._0_4_;
      local_a20._4_4_ = auVar1._4_4_;
      uStack_a18._0_4_ = auVar1._8_4_;
      uStack_a18._4_4_ = auVar1._12_4_;
      uStack_a10._0_4_ = auVar1._16_4_;
      uStack_a10._4_4_ = auVar1._20_4_;
      uStack_a08._0_4_ = auVar1._24_4_;
      uStack_a08._4_4_ = auVar1._28_4_;
      local_a40._0_4_ = local_1480._0_4_;
      local_a40._4_4_ = local_1480._4_4_;
      uStack_a38._0_4_ = local_1480._8_4_;
      uStack_a38._4_4_ = local_1480._12_4_;
      uStack_a30._0_4_ = local_1480._16_4_;
      uStack_a30._4_4_ = local_1480._20_4_;
      uStack_a28._0_4_ = local_1480._24_4_;
      uStack_a28._4_4_ = local_1480._28_4_;
      local_1300._4_4_ = local_a20._4_4_ + local_a40._4_4_;
      local_1300._0_4_ = (float)local_a20 + (float)local_a40;
      uStack_12f8._0_4_ = (float)uStack_a18 + (float)uStack_a38;
      uStack_12f8._4_4_ = uStack_a18._4_4_ + uStack_a38._4_4_;
      uStack_12f0._0_4_ = (float)uStack_a10 + (float)uStack_a30;
      uStack_12f0._4_4_ = uStack_a10._4_4_ + uStack_a30._4_4_;
      auVar54 = _local_1300;
      uStack_12e8._0_4_ = (float)uStack_a08 + (float)uStack_a28;
      uStack_12e8._4_4_ = uStack_a08._4_4_ + uStack_a28._4_4_;
      auVar1 = _local_1300;
      local_7c0 = local_1300;
      uStack_7b8 = uStack_12f8;
      uStack_12f0 = auVar54._16_8_;
      uStack_7b0 = uStack_12f0;
      uStack_12e8 = auVar1._24_8_;
      uStack_7a8 = uStack_12e8;
      local_7e0 = local_12e0;
      uStack_7d8 = uStack_12d8;
      uStack_12d0 = auVar56._16_8_;
      uStack_7d0 = uStack_12d0;
      uStack_12c8 = auVar29._24_8_;
      uStack_7c8 = uStack_12c8;
      local_1300._4_4_ =
           (uint)(local_a20._4_4_ + local_a40._4_4_) ^ local_780._4_4_ ^ local_7a0._4_4_;
      local_1300._0_4_ =
           (uint)((float)local_a20 + (float)local_a40) ^ (uint)local_780 ^ (uint)local_7a0;
      uStack_12f8._0_4_ =
           (uint)((float)uStack_a18 + (float)uStack_a38) ^ (uint)uStack_778 ^ (uint)uStack_798;
      uStack_12f8._4_4_ =
           (uint)(uStack_a18._4_4_ + uStack_a38._4_4_) ^ uStack_778._4_4_ ^ uStack_798._4_4_;
      uStack_12f0._0_4_ =
           (uint)((float)uStack_a10 + (float)uStack_a30) ^ (uint)uStack_770 ^ (uint)uStack_790;
      uStack_12f0._4_4_ =
           (uint)(uStack_a10._4_4_ + uStack_a30._4_4_) ^ uStack_770._4_4_ ^ uStack_790._4_4_;
      auVar54 = _local_1300;
      uStack_12e8._0_4_ =
           (uint)((float)uStack_a08 + (float)uStack_a28) ^ (uint)uStack_768 ^ (uint)uStack_788;
      uStack_12e8._4_4_ =
           (uint)(uStack_a08._4_4_ + uStack_a28._4_4_) ^ uStack_768._4_4_ ^ uStack_788._4_4_;
      auVar2 = _local_1300;
      local_1660 = local_1300;
      uStack_1658 = uStack_12f8;
      uStack_12f0 = auVar54._16_8_;
      uStack_1650 = uStack_12f0;
      uStack_12e8 = auVar2._24_8_;
      uStack_1648 = uStack_12e8;
      local_1550 = local_15f0;
      local_1580 = local_1300;
      uStack_1578 = uStack_12f8;
      uStack_1570 = uStack_12f0;
      uStack_1568 = uStack_12e8;
      auVar1._16_8_ = uStack_12f0;
      auVar1._0_16_ = _local_1300;
      auVar1._24_8_ = uStack_12e8;
      *local_15f0 = auVar1;
      local_15f0 = local_15f0 + 1;
      _local_1300 = auVar2;
      _local_12e0 = auVar29;
      _local_1260 = auVar31;
      uStack_1150 = uStack_1190;
      uStack_1148 = uStack_1188;
      local_1040 = local_1060;
      uStack_1038 = uStack_1058;
      uStack_1030 = uStack_1050;
      uStack_1028 = uStack_1048;
      local_1000 = uVar7;
      uStack_ff8 = uVar8;
      uStack_ff0 = uVar9;
      uStack_fe8 = uVar10;
      local_fd0 = local_fd8;
      local_f68 = local_fc8;
      local_f10 = local_f70;
      local_f08 = local_fc8;
      local_eb0 = local_f70;
      local_e50 = local_f70;
      local_e48 = local_ea8;
      local_df8 = local_fd8;
      local_de8 = local_ea8;
      local_d98 = local_fd8;
      local_d88 = local_ea8;
      local_d38 = local_fd8;
      local_d28 = local_ea8;
      local_d00 = uVar15;
      uStack_cf8 = uVar16;
      uStack_cf0 = uVar17;
      uStack_ce8 = uVar18;
      local_cd8 = local_ea8;
      local_cc8 = local_f70;
      fStack_ca4 = fStack_1444;
      fStack_b44 = fStack_1444;
      fStack_b04 = fStack_1444;
      fStack_ac4 = fStack_1444;
      fStack_a84 = fStack_1444;
      fStack_a44 = fStack_1444;
      local_a40 = local_1480;
      uStack_a38 = uStack_1478;
      uStack_a30 = uStack_1470;
      uStack_a28 = uStack_1468;
      local_a20 = uVar23;
      uStack_a18 = uVar24;
      uStack_a10 = uVar25;
      uStack_a08 = uVar26;
      local_9e0 = uVar19;
      uStack_9d8 = uVar20;
      uStack_9d0 = uVar21;
      uStack_9c8 = uVar22;
      local_980 = local_9a0;
      uStack_978 = uStack_998;
      local_8e0 = local_900;
      uStack_8d8 = uStack_8f8;
      local_8a0 = local_8c0;
      uStack_898 = uStack_8b8;
      local_860 = local_880;
      uStack_858 = uStack_878;
      local_7f0 = local_800;
      local_7a0 = local_1350._0_8_;
      uStack_798 = local_1350._8_8_;
      uStack_790 = local_1360._0_8_;
      uStack_788 = local_1360._8_8_;
      local_780 = uVar11;
      uStack_778 = uVar12;
      uStack_770 = uVar13;
      uStack_768 = uVar14;
      local_740 = local_1370._0_8_;
      uStack_738 = local_1370._8_8_;
      uStack_730 = local_1380._0_8_;
      uStack_728 = local_1380._8_8_;
    }
    for (; local_14d8 = local_1590, local_1618 = local_1528, local_163c + 3 < local_15e4;
        local_163c = local_163c + 4) {
      local_1548 = local_15f0;
      local_600 = *(undefined8 *)*local_15f0;
      uStack_5f8 = *(undefined8 *)(*local_15f0 + 8);
      local_1498 = local_15c9;
      local_14a0 = &local_1670;
      local_5d0 = ZEXT816(0) << 0x20;
      local_5f0 = 0x7fffffff7fffffff;
      uStack_5e8 = 0x7fffffff7fffffff;
      auVar41._8_8_ = 0x7fffffff7fffffff;
      auVar41._0_8_ = 0x7fffffff7fffffff;
      auVar3 = vpand_avx(*(undefined1 (*) [16])*local_15f0,auVar41);
      local_610 = 0x8000000080000000;
      uStack_608 = 0x8000000080000000;
      auVar40._8_8_ = 0x8000000080000000;
      auVar40._0_8_ = 0x8000000080000000;
      auVar4 = vpand_avx(*(undefined1 (*) [16])*local_15f0,auVar40);
      local_660 = auVar3._0_8_;
      uVar7 = local_660;
      uStack_658 = auVar3._8_8_;
      uVar8 = uStack_658;
      local_540 = 0x3fa2f9833fa2f983;
      uStack_538 = 0x3fa2f9833fa2f983;
      local_530._0_4_ = auVar3._0_4_;
      local_530._4_4_ = auVar3._4_4_;
      uStack_528._0_4_ = auVar3._8_4_;
      uStack_528._4_4_ = auVar3._12_4_;
      local_6b0._4_4_ = local_530._4_4_ * 1.2732395;
      local_6b0._0_4_ = (float)local_530 * 1.2732395;
      uStack_6a8._0_4_ = (float)uStack_528 * 1.2732395;
      uStack_6a8._4_4_ = uStack_528._4_4_ * 1.2732395;
      local_4a0 = local_6b0;
      uStack_498 = uStack_6a8;
      local_6d0._4_4_ = (int)(local_530._4_4_ * 1.2732395);
      local_6d0._0_4_ = (int)((float)local_530 * 1.2732395);
      local_6d0._8_4_ = (int)((float)uStack_528 * 1.2732395);
      local_6d0._12_4_ = (int)(uStack_528._4_4_ * 1.2732395);
      local_510 = local_6d0._0_8_;
      uStack_508 = local_6d0._8_8_;
      local_520 = 0x100000001;
      uStack_518 = 0x100000001;
      auVar43._8_8_ = local_6d0._8_8_;
      auVar43._0_8_ = local_6d0._0_8_;
      auVar42._8_8_ = 0x100000001;
      auVar42._0_8_ = 0x100000001;
      auVar3 = vpaddd_avx(auVar43,auVar42);
      local_6d0._0_8_ = auVar3._0_8_;
      local_d0 = local_6d0._0_8_;
      local_6d0._8_8_ = auVar3._8_8_;
      uStack_c8 = local_6d0._8_8_;
      local_e0 = 0xfffffffefffffffe;
      uStack_d8 = 0xfffffffefffffffe;
      auVar47._8_8_ = 0xfffffffefffffffe;
      auVar47._0_8_ = 0xfffffffefffffffe;
      auVar5 = vpand_avx(auVar3,auVar47);
      local_6d0._0_8_ = auVar5._0_8_;
      local_490 = local_6d0._0_8_;
      local_6d0._8_8_ = auVar5._8_8_;
      uStack_488 = local_6d0._8_8_;
      auVar3 = vcvtdq2ps_avx(auVar5);
      local_f0 = local_6d0._0_8_;
      uStack_e8 = local_6d0._8_8_;
      local_100 = 0x400000004;
      uStack_f8 = 0x400000004;
      auVar46._8_8_ = 0x400000004;
      auVar46._0_8_ = 0x400000004;
      auVar6 = vpand_avx(auVar5,auVar46);
      local_6c0._0_8_ = auVar6._0_8_;
      local_4f0 = local_6c0._0_8_;
      local_6c0._8_8_ = auVar6._8_8_;
      uStack_4e8 = local_6c0._8_8_;
      local_4f4 = 0x1d;
      local_6c0 = vpslld_avx(auVar6,ZEXT416(0x1d));
      local_110 = local_6d0._0_8_;
      uStack_108 = local_6d0._8_8_;
      local_120 = 0x200000002;
      uStack_118 = 0x200000002;
      auVar45._8_8_ = 0x200000002;
      auVar45._0_8_ = 0x200000002;
      auVar5 = vpand_avx(auVar5,auVar45);
      local_6d0._0_8_ = auVar5._0_8_;
      local_b0 = local_6d0._0_8_;
      local_6d0._8_8_ = auVar5._8_8_;
      uStack_a8 = local_6d0._8_8_;
      local_c0 = 0;
      local_a0._8_8_ = SUB168(ZEXT816(0),4);
      uStack_b8 = local_a0._8_8_;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_a0._8_8_;
      local_6d0 = vpcmpeqd_avx(auVar5,auVar53 << 0x40);
      local_640 = local_6c0._0_8_;
      uStack_638 = local_6c0._8_8_;
      local_6e0 = local_6c0._0_8_;
      uStack_6d8 = local_6c0._8_8_;
      local_650 = local_6d0._0_8_;
      uStack_648 = local_6d0._8_8_;
      local_6f0 = local_6d0._0_8_;
      uStack_6e8 = local_6d0._8_8_;
      local_6a0 = auVar4._0_8_;
      local_60 = local_6a0;
      uStack_698 = auVar4._8_8_;
      uStack_58 = uStack_698;
      local_70 = local_6c0._0_8_;
      uStack_68 = local_6c0._8_8_;
      local_90 = local_6a0 ^ local_6c0._0_8_;
      uStack_88 = uStack_698 ^ local_6c0._8_8_;
      uStack_698 = uStack_88;
      local_6a0 = local_90;
      local_670 = 0xbf490000bf490000;
      uStack_668 = 0xbf490000bf490000;
      local_680 = 0xb97da000b97da000;
      uStack_678 = 0xb97da000b97da000;
      local_478 = local_6b0;
      local_170 = &local_670;
      local_418 = &local_660;
      local_6b0 = auVar3._0_8_;
      uVar9 = local_6b0;
      uStack_6a8 = auVar3._8_8_;
      uVar10 = uStack_6a8;
      local_160 = 0xbf490000bf490000;
      uStack_158 = 0xbf490000bf490000;
      local_150._0_4_ = auVar3._0_4_;
      local_150._4_4_ = auVar3._4_4_;
      uStack_148._0_4_ = auVar3._8_4_;
      uStack_148._4_4_ = auVar3._12_4_;
      local_130 = (float)local_150 * -0.78515625;
      fStack_12c = local_150._4_4_ * -0.78515625;
      fStack_128 = (float)uStack_148 * -0.78515625;
      fStack_124 = uStack_148._4_4_ * -0.78515625;
      local_140 = local_660;
      uStack_138 = uStack_658;
      local_660 = CONCAT44(fStack_12c + local_530._4_4_,local_130 + (float)local_530);
      uStack_658._0_4_ = fStack_128 + (float)uStack_528;
      uStack_658._4_4_ = fStack_124 + uStack_528._4_4_;
      local_1d0 = &local_680;
      local_1b0 = local_6b0;
      uStack_1a8 = uStack_6a8;
      local_1c0 = 0xb97da000b97da000;
      uStack_1b8 = 0xb97da000b97da000;
      local_190 = (float)local_150 * -0.00024187565;
      fStack_18c = local_150._4_4_ * -0.00024187565;
      fStack_188 = (float)uStack_148 * -0.00024187565;
      fStack_184 = uStack_148._4_4_ * -0.00024187565;
      local_1a0 = local_660;
      uStack_198 = uStack_658;
      fVar57 = local_190 + local_130 + (float)local_530;
      fVar59 = fStack_18c + fStack_12c + local_530._4_4_;
      fVar60 = fStack_188 + fStack_128 + (float)uStack_528;
      fVar62 = fStack_184 + fStack_124 + uStack_528._4_4_;
      local_660 = CONCAT44(fVar59,fVar57);
      uStack_658._0_4_ = fVar60;
      uStack_658._4_4_ = fVar62;
      local_230 = &local_690;
      local_210 = local_6b0;
      uStack_208 = uStack_6a8;
      local_220 = 0xb3222169b3222169;
      uStack_218 = 0xb3222169b3222169;
      local_1f0 = (float)local_150 * -3.774895e-08;
      fStack_1ec = local_150._4_4_ * -3.774895e-08;
      fStack_1e8 = (float)uStack_148 * -3.774895e-08;
      fStack_1e4 = uStack_148._4_4_ * -3.774895e-08;
      local_200 = local_660;
      uStack_1f8 = uStack_658;
      fVar57 = local_1f0 + fVar57;
      fVar59 = fStack_1ec + fVar59;
      fVar60 = fStack_1e8 + fVar60;
      fVar62 = fStack_1e4 + fVar62;
      local_660 = CONCAT44(fVar59,fVar57);
      uStack_658._0_4_ = fVar60;
      uStack_658._4_4_ = fVar62;
      local_560 = local_660;
      uStack_558 = uStack_658;
      local_700 = fVar57 * fVar57;
      fStack_6fc = fVar59 * fVar59;
      fStack_6f8 = fVar60 * fVar60;
      fStack_6f4 = fVar62 * fVar62;
      local_468 = &local_700;
      local_298 = _ps_coscof_p1;
      local_270 = 0x37ccf5ce37ccf5ce;
      uStack_268 = 0x37ccf5ce37ccf5ce;
      local_280 = CONCAT44(fStack_6fc,local_700);
      uStack_278 = CONCAT44(fStack_6f4,fStack_6f8);
      local_250 = local_700 * 2.4433157e-05;
      fStack_24c = fStack_6fc * 2.4433157e-05;
      fStack_248 = fStack_6f8 * 2.4433157e-05;
      fStack_244 = fStack_6f4 * 2.4433157e-05;
      local_260[0] = -0.0013887316;
      local_260[1] = -0.0013887316;
      afStack_258[0] = -0.0013887316;
      afStack_258[1] = -0.0013887316;
      local_6b0._4_4_ = fStack_24c + -0.0013887316;
      local_6b0._0_4_ = local_250 + -0.0013887316;
      uStack_6a8._0_4_ = fStack_248 + -0.0013887316;
      uStack_6a8._4_4_ = fStack_244 + -0.0013887316;
      local_2f8 = _ps_coscof_p2;
      local_2d0 = local_6b0;
      uStack_2c8 = uStack_6a8;
      local_2e0 = CONCAT44(fStack_6fc,local_700);
      uStack_2d8 = CONCAT44(fStack_6f4,fStack_6f8);
      local_2b0 = (local_250 + -0.0013887316) * local_700;
      fStack_2ac = (fStack_24c + -0.0013887316) * fStack_6fc;
      fStack_2a8 = (fStack_248 + -0.0013887316) * fStack_6f8;
      fStack_2a4 = (fStack_244 + -0.0013887316) * fStack_6f4;
      local_2c0[0] = 0.041666646;
      local_2c0[1] = 0.041666646;
      afStack_2b8[0] = 0.041666646;
      afStack_2b8[1] = 0.041666646;
      local_6b0._4_4_ = fStack_2ac + 0.041666646;
      local_6b0._0_4_ = local_2b0 + 0.041666646;
      uStack_6a8._0_4_ = fStack_2a8 + 0.041666646;
      uStack_6a8._4_4_ = fStack_2a4 + 0.041666646;
      local_570 = local_6b0;
      uStack_568 = uStack_6a8;
      local_580 = CONCAT44(fStack_6fc,local_700);
      uStack_578 = CONCAT44(fStack_6f4,fStack_6f8);
      local_6b0._0_4_ = (local_2b0 + 0.041666646) * local_700;
      local_6b0._4_4_ = (fStack_2ac + 0.041666646) * fStack_6fc;
      fVar61 = (fStack_2a8 + 0.041666646) * fStack_6f8;
      fVar63 = (fStack_2a4 + 0.041666646) * fStack_6f4;
      uStack_6a8._0_4_ = fVar61;
      uStack_6a8._4_4_ = fVar63;
      local_590 = local_6b0;
      uStack_588 = uStack_6a8;
      local_5a0 = CONCAT44(fStack_6fc,local_700);
      uStack_598 = CONCAT44(fStack_6f4,fStack_6f8);
      local_6b0._4_4_ = (float)local_6b0._4_4_ * fStack_6fc;
      local_6b0._0_4_ = (float)local_6b0._0_4_ * local_700;
      uStack_6a8._0_4_ = fVar61 * fStack_6f8;
      uStack_6a8._4_4_ = fVar63 * fStack_6f4;
      local_470 = ::_ps_0p5;
      local_450 = local_6b0;
      uStack_448 = uStack_6a8;
      local_430 = CONCAT44(fStack_6fc,local_700);
      uStack_428 = CONCAT44(fStack_6f4,fStack_6f8);
      local_440[0] = 0.5;
      local_440[1] = 0.5;
      afStack_438[0] = 0.5;
      afStack_438[1] = 0.5;
      local_460 = local_700 * 0.5;
      fStack_45c = fStack_6fc * 0.5;
      fStack_458 = fStack_6f8 * 0.5;
      fStack_454 = fStack_6f4 * 0.5;
      auVar44._4_4_ = fStack_45c;
      auVar44._0_4_ = local_460;
      auVar44._8_4_ = fStack_458;
      auVar44._12_4_ = fStack_454;
      auVar3 = vsubps_avx(_local_6b0,auVar44);
      local_6b0 = auVar3._0_8_;
      uVar11 = local_6b0;
      uStack_6a8 = auVar3._8_8_;
      uVar12 = uStack_6a8;
      local_4c0 = 0x3f8000003f800000;
      uStack_4b8 = 0x3f8000003f800000;
      local_4b0._0_4_ = auVar3._0_4_;
      local_4b0._4_4_ = auVar3._4_4_;
      uStack_4a8._0_4_ = auVar3._8_4_;
      uStack_4a8._4_4_ = auVar3._12_4_;
      local_6b0._4_4_ = local_4b0._4_4_ + 1.0;
      local_6b0._0_4_ = (float)local_4b0 + 1.0;
      uStack_6a8._0_4_ = (float)uStack_4a8 + 1.0;
      uStack_6a8._4_4_ = uStack_4a8._4_4_ + 1.0;
      local_408 = local_710;
      local_358 = _ps_sincof_p1;
      local_330 = 0xb94ca1f9b94ca1f9;
      uStack_328 = 0xb94ca1f9b94ca1f9;
      local_340 = CONCAT44(fStack_6fc,local_700);
      uStack_338 = CONCAT44(fStack_6f4,fStack_6f8);
      local_310 = local_700 * -0.00019515296;
      fStack_30c = fStack_6fc * -0.00019515296;
      fStack_308 = fStack_6f8 * -0.00019515296;
      fStack_304 = fStack_6f4 * -0.00019515296;
      local_320[0] = 0.008332161;
      local_320[1] = 0.008332161;
      afStack_318[0] = 0.008332161;
      afStack_318[1] = 0.008332161;
      local_710._4_4_ = fStack_30c + 0.008332161;
      local_710._0_4_ = local_310 + 0.008332161;
      uStack_708._0_4_ = fStack_308 + 0.008332161;
      uStack_708._4_4_ = fStack_304 + 0.008332161;
      local_3b8 = _ps_sincof_p2;
      local_390 = local_710;
      uStack_388 = uStack_708;
      local_3a0 = CONCAT44(fStack_6fc,local_700);
      uStack_398 = CONCAT44(fStack_6f4,fStack_6f8);
      local_370 = (local_310 + 0.008332161) * local_700;
      fStack_36c = (fStack_30c + 0.008332161) * fStack_6fc;
      fStack_368 = (fStack_308 + 0.008332161) * fStack_6f8;
      fStack_364 = (fStack_304 + 0.008332161) * fStack_6f4;
      local_380[0] = -0.16666655;
      local_380[1] = -0.16666655;
      afStack_378[0] = -0.16666655;
      afStack_378[1] = -0.16666655;
      local_710._4_4_ = fStack_36c + -0.16666655;
      local_710._0_4_ = local_370 + -0.16666655;
      uStack_708._0_4_ = fStack_368 + -0.16666655;
      uStack_708._4_4_ = fStack_364 + -0.16666655;
      local_5b0 = local_710;
      uStack_5a8 = uStack_708;
      local_5c0 = CONCAT44(fStack_6fc,local_700);
      uStack_5b8 = CONCAT44(fStack_6f4,fStack_6f8);
      local_710._0_4_ = (local_370 + -0.16666655) * local_700;
      local_710._4_4_ = (fStack_36c + -0.16666655) * fStack_6fc;
      fStack_3c8 = (fStack_368 + -0.16666655) * fStack_6f8;
      fStack_3c4 = (fStack_364 + -0.16666655) * fStack_6f4;
      uStack_708._0_4_ = fStack_3c8;
      uStack_708._4_4_ = fStack_3c4;
      local_3f0 = local_710;
      uStack_3e8 = uStack_708;
      local_400 = local_660;
      uStack_3f8 = uStack_658;
      local_3d0 = (float)local_710._0_4_ * fVar57;
      fStack_3cc = (float)local_710._4_4_ * fVar59;
      fStack_3c8 = fStack_3c8 * fVar60;
      fStack_3c4 = fStack_3c4 * fVar62;
      local_3e0 = local_660;
      uStack_3d8 = uStack_658;
      local_710._4_4_ = fStack_3cc + fVar59;
      local_710._0_4_ = local_3d0 + fVar57;
      uStack_708._0_4_ = fStack_3c8 + fVar60;
      uStack_708._4_4_ = fStack_3c4 + fVar62;
      local_690 = local_6d0._0_8_;
      uStack_688 = local_6d0._8_8_;
      local_620 = local_6d0._0_8_;
      uStack_618 = local_6d0._8_8_;
      local_630 = local_710;
      uStack_628 = uStack_708;
      auVar39._8_8_ = uStack_708;
      auVar39._0_8_ = local_710;
      _local_710 = vpand_avx(local_6d0,auVar39);
      local_50 = local_6b0;
      uStack_48 = uStack_6a8;
      auVar3 = vpcmpeqd_avx(local_6d0,local_6d0);
      auVar50._8_8_ = uStack_6a8;
      auVar50._0_8_ = local_6b0;
      auVar3 = vpand_avx(local_6d0 ^ auVar3,auVar50);
      local_6b0 = auVar3._0_8_;
      uVar13 = local_6b0;
      uStack_6a8 = auVar3._8_8_;
      uVar14 = uStack_6a8;
      local_4d0._0_4_ = auVar3._0_4_;
      local_4d0._4_4_ = auVar3._4_4_;
      uStack_4c8._0_4_ = auVar3._8_4_;
      uStack_4c8._4_4_ = auVar3._12_4_;
      local_4e0._0_4_ = local_710._0_4_;
      local_4e0._4_4_ = local_710._4_4_;
      uStack_4d8._0_4_ = local_710._8_4_;
      uStack_4d8._4_4_ = local_710._12_4_;
      local_6b0._4_4_ = local_4d0._4_4_ + local_4e0._4_4_;
      local_6b0._0_4_ = (float)local_4d0 + (float)local_4e0;
      uStack_6a8._0_4_ = (float)uStack_4c8 + (float)uStack_4d8;
      uStack_6a8._4_4_ = uStack_4c8._4_4_ + uStack_4d8._4_4_;
      local_80 = local_6b0;
      uStack_78 = uStack_6a8;
      auVar49._8_8_ = uStack_6a8;
      auVar49._0_8_ = local_6b0;
      auVar48._8_8_ = uStack_88;
      auVar48._0_8_ = local_90;
      _local_6b0 = auVar49 ^ auVar48;
      local_1670 = local_6b0;
      uStack_1668 = uStack_6a8;
      local_1530 = local_15f0;
      local_1540 = local_6b0;
      uStack_1538 = uStack_6a8;
      *(undefined1 (*) [16])*local_15f0 = _local_6b0;
      local_15f0 = (undefined1 (*) [32])(*local_15f0 + 0x10);
      local_5e0 = local_600;
      uStack_5d8 = uStack_5f8;
      local_550 = local_560;
      uStack_548 = uStack_558;
      local_530 = uVar7;
      uStack_528 = uVar8;
      local_4e0 = local_710;
      uStack_4d8 = uStack_708;
      local_4d0 = uVar13;
      uStack_4c8 = uVar14;
      local_4b0 = uVar11;
      uStack_4a8 = uVar12;
      local_410 = local_418;
      local_3b0 = local_468;
      local_3a8 = local_408;
      local_350 = local_468;
      local_348 = local_408;
      local_2f0 = local_468;
      local_2e8 = local_478;
      local_290 = local_468;
      local_288 = local_478;
      local_238 = local_418;
      local_228 = local_478;
      local_1d8 = local_418;
      local_1c8 = local_478;
      local_178 = local_418;
      local_168 = local_478;
      local_150 = uVar9;
      uStack_148 = uVar10;
      local_a0 = ZEXT816(0) << 0x20;
      local_40 = local_6d0;
    }
    for (; local_163c < local_15e4; local_163c = local_163c + 1) {
      local_1488 = local_15c9;
      local_1490 = local_15f0;
      fVar57 = sinf(*(float *)*local_15f0);
      *(float *)*local_15f0 = fVar57;
      local_15f0 = (undefined1 (*) [32])(*local_15f0 + 4);
    }
  }
  return 0;
}

Assistant:

static int unary_op_inplace(Mat& a, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = a.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = op.func(*ptr);
            ptr++;
        }
    }

    return 0;
}